

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledOutputFile.cpp
# Opt level: O2

int __thiscall Imf_3_2::DeepTiledOutputFile::levelWidth(DeepTiledOutputFile *this,int lx)

{
  Data *pDVar1;
  int iVar2;
  stringstream _iex_replace_s;
  
  pDVar1 = this->_data;
  iVar2 = levelSize(pDVar1->minX,pDVar1->maxX,lx,(pDVar1->tileDesc).roundingMode);
  return iVar2;
}

Assistant:

int
DeepTiledOutputFile::levelWidth (int lx) const
{
    try
    {
        int retVal = levelSize (
            _data->minX, _data->maxX, lx, _data->tileDesc.roundingMode);

        return retVal;
    }
    catch (IEX_NAMESPACE::BaseExc& e)
    {
        REPLACE_EXC (
            e,
            "Error calling levelWidth() on image "
            "file \""
                << fileName () << "\". " << e.what ());
        throw;
    }
}